

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerSafe::RegisterMulticastListener
          (CommissionerSafe *this,Handler<uint8_t> *aHandler,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,uint32_t aTimeout)

{
  _func_void *p_Var1;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  CommissionerSafe *local_78;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  uint32_t local_38;
  
  local_78 = this;
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::function
            ((function<void_(const_unsigned_char_*,_ot::commissioner::Error)> *)&local_70,aHandler);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,aMulticastAddrList);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_38 = aTimeout;
  p_Var1 = (_func_void *)operator_new(0x48);
  *(CommissionerSafe **)p_Var1 = local_78;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_58;
  if (local_60 != (code *)0x0) {
    *(void **)(p_Var1 + 8) = local_70._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_70._8_8_;
    *(code **)(p_Var1 + 0x18) = local_60;
    local_60 = (code *)0x0;
    uStack_58 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(p_Var1 + 0x28),&local_50);
  *(uint32_t *)(p_Var1 + 0x40) = local_38;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:445:22)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:445:22)>
             ::_M_manager;
  local_98._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::RegisterMulticastListener(Handler<uint8_t>                aHandler,
                                                 const std::vector<std::string> &aMulticastAddrList,
                                                 uint32_t                        aTimeout)
{
    PushAsyncRequest([=]() { mImpl->RegisterMulticastListener(aHandler, aMulticastAddrList, aTimeout); });
}